

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

size_t fmt::v8::system_error<>(int error_code,format_string<> fmt)

{
  ulong in_RCX;
  undefined4 in_register_0000003c;
  string_view format_str;
  format_args args;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_a8 [4];
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_88;
  size_t local_80;
  ulong local_78;
  uint local_6c;
  size_t sStack_68;
  int error_code_local;
  format_string<> fmt_local;
  
  local_80 = fmt.str_.size_;
  local_78 = in_RCX;
  local_6c = (uint)fmt.str_.data_;
  sStack_68 = local_80;
  fmt_local.str_.size_ = CONCAT44(in_register_0000003c,error_code);
  local_a8[0] = make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>>();
  format_str.data_ = (char *)(ulong)(uint)fmt.str_.data_;
  local_88 = local_a8;
  format_str.size_ = local_80;
  args.field_1.values_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)0x0;
  args.desc_ = local_78;
  vsystem_error(error_code,format_str,args);
  return CONCAT44(in_register_0000003c,error_code);
}

Assistant:

auto system_error(int error_code, format_string<T...> fmt, T&&... args)
    -> std::system_error {
  return vsystem_error(error_code, fmt, fmt::make_format_args(args...));
}